

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int arenas_narenas_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                      size_t newlen)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  uint *in_RCX;
  tsdn_t *in_R8;
  tsdn_t *in_R9;
  size_t copylen;
  uint narenas;
  int ret;
  size_t local_58;
  uint in_stack_ffffffffffffffb8;
  int iVar4;
  
  malloc_mutex_lock(in_R8,(malloc_mutex_t *)in_R9);
  if ((in_R9 == (tsdn_t *)0x0) && (copylen == 0)) {
    lVar1._0_1_ = (in_R8->tsd).state;
    lVar1._1_1_ = (in_R8->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled;
    lVar1._2_1_ = (in_R8->tsd).
                  cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata_bypass;
    lVar1._3_1_ = (in_R8->tsd).
                  cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    lVar1._4_4_ = (in_R8->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_narenas_tdata;
    if (lVar1 == 4) {
      in_stack_ffffffffffffffb8 = ctl_arenas->narenas;
      if ((in_RCX != (uint *)0x0) && (in_R8 != (tsdn_t *)0x0)) {
        lVar2._0_1_ = (in_R8->tsd).state;
        lVar2._1_1_ = (in_R8->tsd).
                      cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled;
        lVar2._2_1_ = (in_R8->tsd).
                      cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata_bypass;
        lVar2._3_1_ = (in_R8->tsd).
                      cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
        lVar2._4_4_ = (in_R8->tsd).
                      cant_access_tsd_items_directly_use_a_getter_or_setter_narenas_tdata;
        if (lVar2 != 4) {
          uVar3._0_1_ = (in_R8->tsd).state;
          uVar3._1_1_ = (in_R8->tsd).
                        cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled;
          uVar3._2_1_ = (in_R8->tsd).
                        cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata_bypass;
          uVar3._3_1_ = (in_R8->tsd).
                        cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
          uVar3._4_4_ = (in_R8->tsd).
                        cant_access_tsd_items_directly_use_a_getter_or_setter_narenas_tdata;
          if (uVar3 < 4) {
            local_58._0_1_ = (in_R8->tsd).state;
            local_58._1_1_ =
                 (in_R8->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled;
            local_58._2_1_ =
                 (in_R8->tsd).
                 cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata_bypass;
            local_58._3_1_ =
                 (in_R8->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level
            ;
            local_58._4_4_ =
                 (in_R8->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_narenas_tdata;
          }
          else {
            local_58 = 4;
          }
          memcpy(in_RCX,&stack0xffffffffffffffb8,local_58);
          iVar4 = 0x16;
          goto LAB_0014da34;
        }
        *in_RCX = in_stack_ffffffffffffffb8;
      }
      iVar4 = 0;
    }
    else {
      iVar4 = 0x16;
    }
  }
  else {
    iVar4 = 1;
  }
LAB_0014da34:
  malloc_mutex_unlock(in_R9,(malloc_mutex_t *)CONCAT44(iVar4,in_stack_ffffffffffffffb8));
  return iVar4;
}

Assistant:

static int
arenas_narenas_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned narenas;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	READONLY();
	if (*oldlenp != sizeof(unsigned)) {
		ret = EINVAL;
		goto label_return;
	}
	narenas = ctl_arenas->narenas;
	READ(narenas, unsigned);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}